

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O2

nhr_bool nhr_request_send_buffer(nhr_request r,void *data,size_t data_size)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  
  r->error_code = nhr_error_code_none;
  sVar2 = send(r->socket,data,(long)(int)data_size,0);
  bVar1 = true;
  if ((int)sVar2 < 1) {
    piVar3 = __errno_location();
    bVar1 = *piVar3 < 1;
  }
  return bVar1;
}

Assistant:

nhr_bool nhr_request_send_buffer(nhr_request r, const void * data, const size_t data_size) {
	int send_result = -1, error_number = -1;
	r->error_code = nhr_error_code_none;

#if defined(NHR_OS_WINDOWS)
	send_result = send(r->socket, (const char *)data, data_size, 0);
	error_number = WSAGetLastError();
#else
	send_result = (int)send(r->socket, data, (int)data_size, 0);
	error_number = errno;
#endif

	if (send_result > 0) {
		return nhr_true;
	}
	if (error_number > 0) {
		return nhr_false;
	}
	return nhr_true;
}